

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_TestCompressedSurface_Test::TestBody(CTestResource_TestCompressedSurface_Test *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t Size;
  uint64_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t CompBlock [2];
  uint32_t TileSize [2];
  CTestResource_TestCompressedSurface_Test *this_local;
  
  gmmParams.MultiTileArch._0_1_ = 4;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 4;
  memset(&ResourceInfo,0,0x80);
  ResourceInfo._0_4_ = 2;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  gmmParams.CpTag = 0x100;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth = 0x100;
  gmmParams.field_6.BaseWidth64._4_4_ = 1;
  CTestResource::SetTileFlag
            (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)&ResourceInfo,TEST_TILEY);
  ResourceInfo._4_4_ = 0x24;
  ResourceInfo_00 =
       (GMM_RESOURCE_INFO *)
       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                 (CommonULT::pGmmULTClientContext,&ResourceInfo);
  uVar3 = (ulong)gmmParams._40_8_ / ((ulong)gmmParams.MultiTileArch & 0xffffffff);
  uVar1 = CTestResource::GetBppValue(&this->super_CTestResource,TEST_BPP_64);
  uVar4 = (ulong)gmmParams._40_8_ / ((ulong)gmmParams.MultiTileArch & 0xffffffff);
  uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,TEST_BPP_64);
  uVar3 = (uVar3 * uVar1 + 0x7f) - (uVar4 * uVar2 + 0x7f & 0x7f);
  lVar5 = uVar3 * ((gmmParams.field_6.BaseWidth / gmmParams.MultiTileArch.Reserved + 0x1f) -
                  (gmmParams.field_6.BaseWidth / gmmParams.MultiTileArch.Reserved + 0x1f & 0x1f));
  CTestResource::VerifyResourcePitch<true>
            (&this->super_CTestResource,ResourceInfo_00,(uint32_t)uVar3);
  CTestResource::VerifyResourcePitchInTiles<false>
            (&this->super_CTestResource,ResourceInfo_00,(uint32_t)(uVar3 / 0x80));
  CTestResource::VerifyResourceSize<true>
            (&this->super_CTestResource,ResourceInfo_00,(lVar5 + 0xfff) - (lVar5 + 0xfffU & 0xfff));
  CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
  CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
  CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,ResourceInfo_00,0);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  return;
}

Assistant:

TEST_F(CTestResource, TestCompressedSurface)
{
    uint32_t TileSize[]  = {128, 32};
    uint32_t CompBlock[] = {4, 4};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.BaseWidth64          = 0x100;
    gmmParams.BaseHeight           = 0x100;
    gmmParams.Depth                = 0x1;
    SetTileFlag(gmmParams, TEST_TILEY);
    //TODO: Programatically test all compression formats.
    gmmParams.Format = GMM_FORMAT_BC1_UNORM; // BC1 is 4x4 compression block, 64bpe

    GMM_RESOURCE_INFO *ResourceInfo;
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint64_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64 / CompBlock[0] * GetBppValue(TEST_BPP_64), TileSize[0]);
    uint64_t Size  = Pitch * GMM_ULT_ALIGN(gmmParams.BaseHeight / CompBlock[1], TileSize[1]);
    Size           = GMM_ULT_ALIGN(Size, PAGE_SIZE);

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<false>(ResourceInfo, Pitch / TileSize[0]);
    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}